

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj4fio.h
# Opt level: O0

ssize_t fiobj_send_free(intptr_t uuid,FIOBJ o)

{
  fio_write_args_s options;
  ssize_t sVar1;
  undefined1 local_38;
  undefined7 uStack_37;
  undefined1 local_30 [8];
  fio_str_info_s s;
  FIOBJ o_local;
  intptr_t uuid_local;
  
  s.data = (char *)o;
  fiobj_obj2cstr((fio_str_info_s *)local_30,o);
  options.after.dealloc = fiobj4sock_dealloc;
  options.data.buffer = s.data;
  options.length = s.capa;
  options.offset = s.len - (long)s.data;
  options._32_8_ = CONCAT71(uStack_37,local_38) & 0xfffffffffffffff0;
  sVar1 = fio_write2_fn(uuid,options);
  return sVar1;
}

Assistant:

static inline __attribute__((unused)) ssize_t fiobj_send_free(intptr_t uuid,
                                                              FIOBJ o) {
  fio_str_info_s s = fiobj_obj2cstr(o);
  return fio_write2(uuid, .data.buffer = (void *)(o),
                    .offset = (uintptr_t)(((intptr_t)s.data) - ((intptr_t)(o))),
                    .length = s.len, .after.dealloc = fiobj4sock_dealloc);
}